

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O1

void __thiscall
TPZGeoMesh::FindElement
          (TPZGeoMesh *this,
          map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
          *elmap,int64_t currentnode,TPZGeoEl **candidate,int *candidateside)

{
  TPZGeoEl *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  _Self __tmp;
  int iVar7;
  TPZGeoElSide thisside;
  TPZGeoElSide father;
  TPZGeoElSide neigh;
  TPZGeoElSide local_78;
  undefined1 local_60 [8];
  long local_58;
  int local_50;
  undefined1 local_48 [8];
  TPZGeoEl *local_40;
  int local_38;
  
  *candidate = (TPZGeoEl *)0x0;
  p_Var5 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    do {
      if ((_Rb_tree_header *)p_Var5 == &(elmap->_M_t)._M_impl.super__Rb_tree_header) {
        return;
      }
      pTVar1 = (TPZGeoEl *)p_Var5[1]._M_parent;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      iVar2 = (**(code **)(*(long *)pTVar1 + 0xf0))(pTVar1);
      iVar3 = (**(code **)(*(long *)pTVar1 + 0x98))(pTVar1);
    } while (iVar2 <= iVar3);
    do {
      local_78.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
      local_78.fGeoEl = pTVar1;
      local_78.fSide = iVar3;
      iVar4 = TPZGeoElSide::Dimension(&local_78);
      iVar7 = 6;
      if (iVar4 < 2) {
        (**(code **)(*(long *)pTVar1 + 0x188))(local_48,pTVar1,iVar3);
        (**(code **)(*(long *)pTVar1 + 0x248))(local_60,pTVar1,iVar3);
        iVar7 = 0;
        if (((local_40 == local_78.fGeoEl) && (local_38 == local_78.fSide)) &&
           ((local_58 == 0 || (local_50 < 0)))) {
          iVar7 = 0;
          lVar6 = (**(code **)(*(long *)pTVar1 + 0x128))(pTVar1,iVar3,0);
          if (lVar6 == currentnode) {
            *candidate = pTVar1;
            *candidateside = iVar3;
            iVar7 = 1;
          }
        }
      }
      if ((iVar7 != 6) && (iVar7 != 0)) goto LAB_0110c04a;
      iVar3 = iVar3 + 1;
    } while (iVar2 != iVar3);
    iVar7 = 0;
LAB_0110c04a:
    if (iVar7 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void TPZGeoMesh::FindElement(std::map<int64_t,TPZGeoEl *> &elmap,int64_t currentnode,TPZGeoEl* &candidate,int &candidateside)
{
    candidate = 0;
    //TPZPix iel = elmap.First();
    map<int64_t , TPZGeoEl *>::iterator ielprev, iel = elmap.begin();
    while(iel!=elmap.end()) {
		TPZGeoEl *el = iel->second;//elmap.Contents(iel);
		ielprev=iel;
		iel++;//elmap.Next(iel);
		int ns = el->NSides();
		int is = el->NCornerNodes();
		for(; is < ns; is++) {
			TPZGeoElSide thisside(el,is);
			if (thisside.Dimension() > 1) continue;
			TPZGeoElSide neigh = el->Neighbour(is);
			TPZGeoElSide father = el->Father2(is);
			
#ifdef PZDEBUG2
			std::stringstream sout;
			sout << __PRETTY_FUNCTION__ << " for elidx " << el->Index() << std::endl;
			sout << "\tthiside " << el->Index() << "/" << is << std::endl;
			if (neigh.Element()) sout << "\tneighsd " << neigh.Element()->Index() << "/" << neigh.Side() << std::endl;
			if (father.Element())sout << "\tfathers " << father.Element()->Index() << "/" << father.Side() << std::endl;
#endif
			
			if(neigh == thisside && !father.Exists() && el->SideNodeIndex(is,0) == currentnode) {
				candidate = el;
				candidateside = is;
				
#ifdef PZDEBUG2
				sout << "\t\t\tNew Candidate found el/side = " << el << "/" << is << std::endl;
				LOGPZ_DEBUG (logger,sout.str().c_str());
#endif
				
				return;
			}
			
#ifdef PZDEBUG2
			else
			{
				sout << "candidate doesn't match...";
				LOGPZ_DEBUG(logger,sout.str().c_str());
			}
#endif
		}
	}
	
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "No neighbour found for node " << currentnode << " elmap \n";
		for(iel=elmap.begin(); iel!=elmap.end(); iel++)
		{
			iel->second->Print(sout);
		}
		LOGPZ_WARN(logger,sout.str());
	}
#endif
	
}